

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t archive_read_format_tar_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  tar *tar;
  bool bVar2;
  bool bVar3;
  long lVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  mode_t mVar10;
  archive_read *a_00;
  size_t *psVar11;
  gnu_sparse *sparse;
  archive_string_conv *paVar12;
  archive_acl *acl;
  int *piVar13;
  dev_t dVar14;
  char *pcVar15;
  wchar_t *pwVar16;
  size_t sVar17;
  int64_t iVar18;
  int64_t remaining_00;
  ulong uVar19;
  long lVar20;
  wchar_t *pwVar21;
  char *pcVar23;
  long lVar25;
  void *pvVar26;
  tar *tar_00;
  uint uVar27;
  size_t *in_R8;
  sparse_block *sb;
  sparse_block *psVar28;
  size_t sVar29;
  ulong uStack_90;
  uint local_84;
  size_t unconsumed;
  int64_t remaining;
  size_t sStack_70;
  size_t local_68;
  int local_54;
  size_t local_50;
  wchar_t local_44;
  archive_string *local_40;
  size_t local_38;
  wchar_t *pwVar22;
  char *pcVar24;
  
  unconsumed = 0;
  archive_entry_set_dev(entry,(long)archive_read_format_tar_read_header::default_dev + 1);
  lVar25 = (long)archive_read_format_tar_read_header::default_inode;
  archive_read_format_tar_read_header::default_inode = (wchar_t)(lVar25 + 1);
  archive_entry_set_ino(entry,lVar25 + 1);
  if (L'\xfffe' < archive_read_format_tar_read_header::default_inode) {
    archive_read_format_tar_read_header::default_dev =
         archive_read_format_tar_read_header::default_dev + L'\x01';
    archive_read_format_tar_read_header::default_inode = L'\0';
  }
  tar = (tar *)a->format->data;
  tar->entry_offset = 0;
  gnu_clear_sparse_list(tar);
  tar->size_fields = '\0';
  tar->sconv = tar->opt_sconv;
  if (tar->opt_sconv == (archive_string_conv *)0x0) {
    if (tar->init_default_conversion == 0) {
      paVar12 = archive_string_default_conversion_for_read((archive_conflict *)a);
      tar->sconv_default = paVar12;
      tar->init_default_conversion = 1;
    }
    else {
      paVar12 = tar->sconv_default;
    }
    tar->sconv = paVar12;
  }
  tar->pax_hdrcharset_utf8 = 1;
  tar->sparse_gnu_attributes_seen = '\0';
  (tar->entry_gname).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  (tar->entry_linkpath).length = 0;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format = 0x30000;
    (a->archive).archive_format_name = "tar";
  }
  local_40 = &tar->localname;
  local_54 = 0;
  wVar9 = L'\0';
  local_84 = 0;
  bVar3 = false;
  bVar2 = false;
LAB_002445f3:
  tar_flush_unconsumed(a,&unconsumed);
  pvVar26 = (void *)0x200;
  a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)&local_38);
  if (local_38 == 0) {
    uStack_90 = 1;
    if (local_54 == 0) goto LAB_00245319;
    pcVar15 = "Damaged tar archive (end-of-archive within a sequence of headers)";
    iVar6 = 0x16;
LAB_002452bb:
    archive_set_error(&a->archive,iVar6,pcVar15);
  }
  else {
    if (a_00 == (archive_read *)0x0) {
      pcVar15 = "Truncated tar archive detected while reading next header";
      iVar6 = 0x54;
      goto LAB_002452bb;
    }
    sVar29 = unconsumed + 0x200;
    unconsumed = sVar29;
    if (((char)(a_00->archive).magic == '\0') &&
       (wVar5 = archive_block_is_null((char *)a_00), wVar5 != L'\0')) {
      if (tar->read_concatenated_archives == 0) goto LAB_002452ce;
      goto LAB_002445f3;
    }
    wVar5 = checksum(a_00,pvVar26);
    if (wVar5 == L'\0') {
      tar_flush_unconsumed(a,&unconsumed);
      archive_set_error(&a->archive,0x16,"Damaged tar archive (bad header checksum)");
      uStack_90 = 0xffffffffffffffe2;
      if (local_54 == 0) {
        uStack_90 = 0xfffffffffffffff6;
      }
      uStack_90 = uStack_90 & 0xffffffff;
      goto LAB_00245319;
    }
    cVar1 = a_00->field_0x9c;
    tar_00 = (tar *)&remaining;
    if (cVar1 == 'x') {
      if ((local_84 & 0x20) != 0) goto LAB_002452c6;
      (a->archive).archive_format = 0x30002;
      pcVar15 = "POSIX pax interchange format";
LAB_0024484f:
      local_84 = local_84 | 0x20;
      (a->archive).archive_format_name = pcVar15;
      in_R8 = &unconsumed;
      wVar5 = header_pax_extension(a,tar,entry,a_00,in_R8);
LAB_00245237:
      if (wVar9 < wVar5) {
        wVar5 = wVar9;
      }
      wVar9 = wVar5;
      if (wVar9 != L'\xffffffe2') {
        if (local_84 != 0) {
          local_54 = 1;
        }
        goto LAB_002445f3;
      }
    }
    else {
      if (cVar1 == 'K') {
        if ((local_84 & 4) != 0) goto LAB_002452c6;
        remaining = 0;
        sStack_70 = 0;
        local_68 = 0;
        wVar5 = read_body_to_string(a,tar_00,(archive_string *)a_00,&unconsumed,in_R8);
        if (wVar5 == L'\0') {
          archive_entry_set_link(entry,(char *)remaining);
        }
        local_84 = local_84 | 4;
LAB_00244f7e:
        archive_string_free((archive_string *)&remaining);
        goto LAB_00245237;
      }
      if (cVar1 == 'L') {
        if ((local_84 & 8) == 0) {
          remaining = 0;
          sStack_70 = 0;
          local_68 = 0;
          wVar5 = read_body_to_string(a,tar_00,(archive_string *)a_00,&unconsumed,in_R8);
          if (wVar5 == L'\0') {
            wVar5 = _archive_entry_copy_pathname_l(entry,(char *)remaining,sStack_70,tar->sconv);
            if (wVar5 == L'\0') {
              wVar5 = L'\0';
            }
            else {
              wVar5 = set_conversion_failed_error(a,tar->sconv,"Pathname");
            }
          }
          local_84 = local_84 | 8;
          goto LAB_00244f7e;
        }
      }
      else if (cVar1 == 'V') {
        if (!bVar2) {
          bVar2 = true;
          lVar25 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
          if (0x100000 < lVar25) {
LAB_002447a3:
            wVar5 = L'\xffffffe2';
            goto LAB_00245237;
          }
LAB_002447f0:
          unconsumed = (lVar25 + 0x1ffU & 0xfffffffffffffe00) + sVar29;
LAB_00245234:
          wVar5 = L'\0';
          goto LAB_00245237;
        }
      }
      else if (cVar1 == 'X') {
        if ((local_84 & 0x20) == 0) {
          (a->archive).archive_format = 0x30002;
          pcVar15 = "POSIX pax interchange format (Sun variant)";
          goto LAB_0024484f;
        }
      }
      else if (cVar1 == 'g') {
        if (!bVar3) {
          bVar3 = true;
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          lVar25 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
          if (0xfffffffffffffff < lVar25) goto LAB_002447a3;
          goto LAB_002447f0;
        }
      }
      else if (cVar1 == 'A') {
        if ((local_84 & 1) == 0) {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "Solaris tar";
          local_50 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
          remaining = 0;
          sStack_70 = 0;
          local_68 = 0;
          wVar5 = read_body_to_string(a,tar_00,(archive_string *)a_00,&unconsumed,in_R8);
          if (wVar5 == L'\0') {
            lVar25 = -1;
            uVar19 = 0;
            psVar11 = (size_t *)remaining;
            while( true ) {
              cVar1 = (char)*psVar11;
              if ((cVar1 == '\0') || ((size_t *)(remaining + local_50) <= psVar11)) break;
              uVar27 = (int)CONCAT71((int7)((ulong)tar_00 >> 8),cVar1) - 0x38;
              in_R8 = (size_t *)(ulong)uVar27;
              if ((byte)uVar27 < 0xf8) {
                pcVar15 = "Malformed Solaris ACL attribute (invalid digit)";
                goto LAB_00244f69;
              }
              if (0xffffff < uVar19 << 3) {
                pcVar15 = "Malformed Solaris ACL attribute (count too large)";
                goto LAB_00244f69;
              }
              tar_00 = (tar *)(ulong)(byte)(cVar1 - 0x30);
              uVar19 = uVar19 << 3 | (ulong)tar_00;
              psVar11 = (size_t *)((long)psVar11 + 1);
              lVar25 = lVar25 + -1;
            }
            if ((uVar19 & 0xfffffffffffc0000) == 0x40000) {
              wVar5 = L'Ā';
LAB_00244e76:
              in_R8 = (size_t *)((long)psVar11 + 1);
              if (in_R8 < (size_t *)(remaining + local_50)) {
                lVar4 = 1;
                do {
                  lVar20 = lVar4;
                  if (*(char *)((long)psVar11 + lVar20) == '\0') break;
                  lVar4 = lVar20 + 1;
                } while ((ulong)(lVar20 + (long)psVar11) < (long)in_R8 + local_50 + lVar25);
                local_44 = wVar5;
                if (tar->sconv_acl == (archive_string_conv *)0x0) {
                  paVar12 = archive_string_conversion_from_charset
                                      ((archive_conflict *)a,"UTF-8",L'\x01');
                  tar->sconv_acl = paVar12;
                  wVar5 = L'\xffffffe2';
                  if (paVar12 == (archive_string_conv *)0x0) goto LAB_00244f79;
                }
                (tar->localname).length = 0;
                archive_strncat(local_40,in_R8,lVar20 - 1);
                acl = archive_entry_acl(entry);
                wVar5 = archive_acl_from_text_l(acl,(tar->localname).s,local_44,tar->sconv_acl);
                mVar10 = archive_entry_perm(entry);
                archive_entry_set_perm(entry,mVar10);
                if (wVar5 == L'\0') {
                  wVar5 = L'\0';
                }
                else {
                  piVar13 = __errno_location();
                  if (*piVar13 == 0xc) {
                    iVar6 = 0xc;
                    pcVar15 = "Can\'t allocate memory for ACL";
                  }
                  else {
                    iVar6 = -1;
                    pcVar15 = "Malformed Solaris ACL attribute (unparsable)";
                  }
                  archive_set_error(&a->archive,iVar6,pcVar15);
                }
                goto LAB_00244f79;
              }
              pcVar15 = "Malformed Solaris ACL attribute (body overflow)";
LAB_00244f69:
              archive_set_error(&a->archive,-1,pcVar15);
            }
            else {
              if ((uVar19 & 0xfffffffffffc0000) == 0xc0000) {
                wVar5 = L'㰀';
                goto LAB_00244e76;
              }
              archive_set_error(&a->archive,-1,
                                "Malformed Solaris ACL attribute (unsupported type %lo)");
            }
            wVar5 = L'\xffffffec';
          }
LAB_00244f79:
          local_84 = local_84 | 1;
          goto LAB_00244f7e;
        }
      }
      else {
        if (*(long *)((long)&a_00->bidders[0].name + 1) == 0x20207261747375) {
          (a->archive).archive_format = 0x30004;
          (a->archive).archive_format_name = "GNU tar format";
          pcVar15 = archive_entry_pathname(entry);
          if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
             (wVar5 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
             wVar5 != L'\0')) {
            wVar7 = set_conversion_failed_error(a,tar->sconv,"Pathname");
            wVar5 = L'\xffffffe2';
            if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
          }
          pcVar15 = archive_entry_uname(entry);
          if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
             (wVar5 = _archive_entry_copy_uname_l
                                (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,tar->sconv)
             , wVar5 != L'\0')) {
            wVar7 = set_conversion_failed_error(a,tar->sconv,"Uname");
            wVar5 = L'\xffffffe2';
            if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
          }
          pcVar15 = archive_entry_gname(entry);
          if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
             (wVar5 = _archive_entry_copy_gname_l
                                (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,tar->sconv),
             wVar5 != L'\0')) {
            wVar7 = set_conversion_failed_error(a,tar->sconv,"Gname");
            wVar5 = L'\xffffffe2';
            if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
          }
          if ((byte)(a_00->field_0x9c - 0x33) < 2) {
            wVar5 = archive_entry_rdev_is_set(entry);
            if (wVar5 == L'\0') {
              dVar14 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
              archive_entry_set_rdevmajor(entry,dVar14);
              dVar14 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
              archive_entry_set_rdevminor(entry,dVar14);
            }
          }
          else {
            archive_entry_set_rdev(entry,0);
          }
          wVar5 = archive_entry_atime_is_set(entry);
          if ((wVar5 == L'\0') &&
             (iVar18 = tar_atol((char *)((long)&a_00->bidders[4].data + 1),0xc), 0 < iVar18)) {
            archive_entry_set_atime(entry,iVar18,0);
          }
          wVar5 = archive_entry_ctime_is_set(entry);
          if ((wVar5 == L'\0') &&
             (iVar18 = tar_atol((char *)((long)&a_00->bidders[4].name + 5),0xc), 0 < iVar18)) {
            archive_entry_set_ctime(entry,iVar18,0);
          }
          if (*(char *)((long)&a_00->bidders[9].vtable + 3) != '\0') {
            iVar18 = tar_atol((char *)((long)&a_00->bidders[9].vtable + 3),0xc);
            tar->GNU_sparse_realsize = iVar18;
            tar->size_fields = tar->size_fields | 2;
          }
          if (*(char *)((long)&a_00->bidders[5].vtable + 2) != '\0') {
            wVar5 = gnu_sparse_old_parse
                              (a,tar,(gnu_sparse *)((long)&a_00->bidders[5].vtable + 2),L'\x04');
            if (wVar5 != L'\0') {
LAB_00244d0e:
              wVar5 = L'\xffffffe2';
              goto LAB_002450fa;
            }
            if (*(char *)((long)&a_00->bidders[9].vtable + 2) != '\0') {
              do {
                tar_flush_unconsumed(a,&unconsumed);
                sparse = (gnu_sparse *)__archive_read_ahead(a,0x200,&remaining);
                if (sparse == (gnu_sparse *)0x0) {
                  archive_set_error(&a->archive,0x54,
                                    "Truncated tar archive detected while reading sparse file data")
                  ;
                  goto LAB_00244d0e;
                }
                unconsumed = 0x200;
                wVar5 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
                if (wVar5 != L'\0') goto LAB_00244d0e;
              } while (sparse[0x15].offset[0] != '\0');
              if (tar->sparse_list != (sparse_block *)0x0) {
                tar->entry_offset = tar->sparse_list->offset;
              }
            }
          }
          wVar7 = header_common(a,tar,entry,a_00);
          wVar5 = L'\xffffffe2';
          if (wVar7 != L'\xffffffe2') {
            tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
            wVar5 = wVar7;
          }
        }
        else {
          iVar6 = bcmp((void *)((long)&a_00->bidders[0].name + 1),"ustar",5);
          if (iVar6 == 0) {
            if ((a->archive).archive_format != 0x30002) {
              (a->archive).archive_format = 0x30001;
              (a->archive).archive_format_name = "POSIX ustar format";
            }
            pcVar15 = archive_entry_pathname(entry);
            pwVar16 = archive_entry_pathname_w(entry);
            if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
               ((pwVar16 == (wchar_t *)0x0 || (*pwVar16 == L'\0')))) {
              local_68 = 0;
              remaining = 0;
              sStack_70 = 0;
              if ((*(char *)((long)&a_00->bidders[4].data + 1) != '\0') &&
                 (archive_strncat((archive_string *)&remaining,
                                  (void *)((long)&a_00->bidders[4].data + 1),0x9b),
                 *(char *)(remaining + -1 + sStack_70) != '/')) {
                archive_strappend_char((archive_string *)&remaining,'/');
              }
              archive_strncat((archive_string *)&remaining,a_00,100);
              wVar5 = _archive_entry_copy_pathname_l(entry,(char *)remaining,sStack_70,tar->sconv);
              if (wVar5 == L'\0') {
                wVar7 = L'\0';
              }
              else {
                wVar7 = set_conversion_failed_error(a,tar->sconv,"Pathname");
                wVar5 = L'\xffffffe2';
                if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
              }
              archive_string_free((archive_string *)&remaining);
            }
            else {
              wVar7 = L'\0';
            }
            wVar8 = header_common(a,tar,entry,a_00);
            wVar5 = L'\xffffffe2';
            if (wVar8 != L'\xffffffe2') {
              if (wVar8 < wVar7) {
                wVar7 = wVar8;
              }
              pcVar15 = archive_entry_uname(entry);
              if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
                 (wVar5 = _archive_entry_copy_uname_l
                                    (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,
                                     tar->sconv), wVar5 != L'\0')) {
                wVar7 = set_conversion_failed_error(a,tar->sconv,"Uname");
                wVar5 = L'\xffffffe2';
                if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
              }
              pcVar15 = archive_entry_gname(entry);
              if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
                 (wVar5 = _archive_entry_copy_gname_l
                                    (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,
                                     tar->sconv), wVar5 != L'\0')) {
                wVar7 = set_conversion_failed_error(a,tar->sconv,"Gname");
                wVar5 = L'\xffffffe2';
                if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
              }
              if ((byte)(a_00->field_0x9c - 0x33) < 2) {
                wVar5 = archive_entry_rdev_is_set(entry);
                if (wVar5 == L'\0') {
                  local_50 = CONCAT44(local_50._4_4_,wVar7);
                  dVar14 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
                  archive_entry_set_rdevmajor(entry,dVar14);
                  wVar7 = (wchar_t)local_50;
                  dVar14 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
                  archive_entry_set_rdevminor(entry,dVar14);
                }
              }
              else {
                archive_entry_set_rdev(entry,0);
              }
              tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
              wVar5 = wVar7;
            }
          }
          else {
            (a->archive).archive_format = 0x30000;
            (a->archive).archive_format_name = "tar (non-POSIX)";
            pcVar15 = archive_entry_pathname(entry);
            pwVar16 = archive_entry_pathname_w(entry);
            if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
               (((pwVar16 == (wchar_t *)0x0 || (*pwVar16 == L'\0')) &&
                (wVar5 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
                wVar5 != L'\0')))) {
              wVar7 = set_conversion_failed_error(a,tar->sconv,"Pathname");
              wVar5 = L'\xffffffe2';
              if (wVar7 == L'\xffffffe2') goto LAB_002450fa;
            }
            else {
              wVar7 = L'\0';
            }
            wVar5 = header_common(a,tar,entry,a_00);
            if (wVar7 < wVar5) {
              wVar5 = wVar7;
            }
            tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
          }
        }
LAB_002450fa:
        if (wVar9 < wVar5) {
          wVar5 = wVar9;
        }
        if (wVar5 < L'\xffffffec') goto LAB_002452c6;
        if ((tar->process_mac_extensions == 0) || ((local_84 & 0x200) != 0)) {
LAB_00245440:
          if (tar->sparse_gnu_attributes_seen == '\0') goto LAB_002455d4;
          if ((tar->filetype == '0') || (tar->filetype == 'S')) {
            if (tar->sparse_gnu_major == 1) {
              if (tar->sparse_gnu_minor == 0) {
                gnu_clear_sparse_list(tar);
                remaining = tar->entry_bytes_remaining;
                iVar18 = gnu_sparse_10_atol(a,tar,&remaining,&unconsumed);
                if ((int)iVar18 < 0) goto LAB_002455dc;
                iVar6 = (int)iVar18 + 1;
                goto LAB_0024552c;
              }
            }
            else if ((tar->sparse_gnu_major == 0) &&
                    (uStack_90 = (ulong)(uint)wVar5, (uint)tar->sparse_gnu_minor < 2))
            goto LAB_00245319;
            pcVar15 = "Unrecognized GNU sparse file format";
          }
          else {
            pcVar15 = "Non-regular file cannot be sparse";
          }
          archive_set_error(&a->archive,-1,pcVar15);
          uStack_90 = 0xffffffffffffffec;
          goto LAB_00245319;
        }
        pwVar16 = archive_entry_pathname_w(entry);
        pwVar21 = pwVar16;
        if (pwVar16 == (wchar_t *)0x0) {
          pcVar15 = archive_entry_pathname(entry);
          pcVar24 = pcVar15;
          if (pcVar15 != (char *)0x0) {
            do {
              while( true ) {
                pcVar23 = pcVar24 + 1;
                cVar1 = *pcVar24;
                pcVar24 = pcVar23;
                if (cVar1 != '/') break;
                if (*pcVar23 != '\0') {
                  pcVar15 = pcVar23;
                }
              }
            } while (cVar1 != '\0');
            if (((*pcVar15 != '.') || (pcVar15[1] != '_')) || (pcVar15[2] == '\0'))
            goto LAB_00245440;
          }
        }
        else {
          do {
            while( true ) {
              pwVar22 = pwVar21 + 1;
              wVar9 = *pwVar21;
              pwVar21 = pwVar22;
              if (wVar9 != L'/') break;
              if (*pwVar22 != L'\0') {
                pwVar16 = pwVar22;
              }
            }
          } while (wVar9 != L'\0');
          if (((*pwVar16 != L'.') || (pwVar16[1] != L'_')) || (pwVar16[2] == L'\0'))
          goto LAB_00245440;
        }
        uVar19 = archive_entry_size(entry);
        if (-1 < (long)uVar19) {
          if (0x1000000 < uVar19) {
            archive_set_error(&a->archive,-1,"Oversized AppleDouble extension has size %llu > %llu",
                              uVar19,0x1000000);
            goto LAB_002452c6;
          }
          tar_flush_unconsumed(a,&unconsumed);
          pvVar26 = __archive_read_ahead(a,uVar19,(ssize_t *)0x0);
          if (pvVar26 != (void *)0x0) {
            archive_entry_clear(entry);
            archive_entry_copy_mac_metadata(entry,pvVar26,uVar19);
            unconsumed = (size_t)((int)uVar19 + 0x1ffU & 0x3fffe00);
            wVar9 = wVar5 >> 0x1f & wVar5;
            local_84 = 0x200;
            bVar3 = false;
            bVar2 = false;
            goto LAB_00245234;
          }
          archive_set_error(&a->archive,0x16,
                            "Truncated archive detected while reading macOS metadata");
        }
        unconsumed = 0;
      }
    }
  }
LAB_002452c6:
  uStack_90 = 0xffffffe2;
  goto LAB_00245319;
LAB_002452ce:
  tar_flush_unconsumed(a,&unconsumed);
  pcVar15 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  uStack_90 = 1;
  if (((pcVar15 != (char *)0x0) && (*pcVar15 == '\0')) &&
     (wVar9 = archive_block_is_null(pcVar15), wVar9 != L'\0')) {
    __archive_read_consume(a,0x200);
  }
  archive_clear_error(&a->archive);
  goto LAB_00245319;
LAB_0024552c:
  iVar6 = iVar6 + -1;
  if (0 < iVar6) {
    iVar18 = gnu_sparse_10_atol(a,tar,&remaining,&unconsumed);
    if (((iVar18 < 0) ||
        (remaining_00 = gnu_sparse_10_atol(a,tar,&remaining,&unconsumed), remaining_00 < 0)) ||
       (wVar9 = gnu_add_sparse_entry(a,tar,iVar18,remaining_00), wVar9 != L'\0')) goto LAB_002455dc;
    goto LAB_0024552c;
  }
  tar_flush_unconsumed(a,&unconsumed);
  lVar25 = tar->entry_bytes_remaining - remaining;
  uStack_90 = (ulong)(-(int)lVar25 & 0x1ff);
  if (((long)uStack_90 <= remaining) &&
     (uVar19 = __archive_read_consume(a,uStack_90), uStack_90 == uVar19)) {
    uStack_90 = uStack_90 + lVar25;
    if (-1 < (long)uStack_90) {
      tar->entry_bytes_remaining = tar->entry_bytes_remaining - uStack_90;
LAB_002455d4:
      uStack_90 = (ulong)(uint)wVar5;
    }
    goto LAB_00245319;
  }
LAB_002455dc:
  uStack_90 = 0xffffffffffffffe2;
LAB_00245319:
  tar_flush_unconsumed(a,&unconsumed);
  psVar28 = tar->sparse_list;
  if (psVar28 == (sparse_block *)0x0) {
    wVar9 = gnu_add_sparse_entry(a,tar,0,tar->entry_bytes_remaining);
    if (wVar9 != L'\0') {
      return L'\xffffffe2';
    }
  }
  else {
    for (; psVar28 != (sparse_block *)0x0; psVar28 = psVar28->next) {
      if (psVar28->hole == 0) {
        archive_entry_sparse_add_entry(entry,psVar28->offset,psVar28->remaining);
      }
    }
  }
  wVar9 = (wchar_t)uStack_90;
  if ((wchar_t)uStack_90 == L'\0') {
    mVar10 = archive_entry_filetype(entry);
    wVar9 = L'\0';
    if (mVar10 == 0x8000) {
      pwVar16 = archive_entry_pathname_w(entry);
      if (pwVar16 == (wchar_t *)0x0) {
        pcVar15 = archive_entry_pathname(entry);
        if (pcVar15 == (char *)0x0) {
          return L'\0';
        }
        sVar17 = strlen(pcVar15);
        if (sVar17 == 0) {
          return L'\0';
        }
        if (pcVar15[sVar17 - 1] != '/') {
          return L'\0';
        }
      }
      else {
        sVar17 = wcslen(pwVar16);
        if (sVar17 == 0) {
          return L'\0';
        }
        if (pwVar16[sVar17 - 1] != L'/') {
          return L'\0';
        }
      }
      archive_entry_set_filetype(entry,0x4000);
      tar->entry_bytes_remaining = 0;
      tar->entry_padding = 0;
      wVar9 = L'\0';
    }
  }
  return wVar9;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err = ARCHIVE_OK, err2;
	int eof_fatal = 0; /* EOF is okay at some points... */
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Bitmask of what header types we've seen. */
	int32_t seen_headers = 0;
	static const int32_t seen_A_header = 1;
	static const int32_t seen_g_header = 2;
	static const int32_t seen_K_header = 4;
	static const int32_t seen_L_header = 8;
	static const int32_t seen_V_header = 16;
	static const int32_t seen_x_header = 32; /* Also X */
	static const int32_t seen_mac_metadata = 512;

	tar->pax_hdrcharset_utf8 = 1;
	tar->sparse_gnu_attributes_seen = 0;
	archive_string_empty(&(tar->entry_gname));
	archive_string_empty(&(tar->entry_pathname));
	archive_string_empty(&(tar->entry_pathname_override));
	archive_string_empty(&(tar->entry_uname));
	archive_string_empty(&tar->entry_linkpath);

	/* Ensure format is set. */
	if (a->archive.archive_format_name == NULL) {
		a->archive.archive_format = ARCHIVE_FORMAT_TAR;
		a->archive.archive_format_name = "tar";
	}

	/*
	 * TODO: Write global/default pax options into
	 * 'entry' struct here before overwriting with
	 * file-specific options.
	 */

	/* Loop over all the headers needed for the next entry */
	for (;;) {

		/* Find the next valid header record. */
		while (1) {
			tar_flush_unconsumed(a, unconsumed);

			/* Read 512-byte header record */
			h = __archive_read_ahead(a, 512, &bytes);
			if (bytes == 0) { /* EOF at a block boundary. */
				if (eof_fatal) {
					/* We've read a special header already;
					 * if there's no regular header, then this is
					 * a premature EOF. */
					archive_set_error(&a->archive, EINVAL,
							  "Damaged tar archive (end-of-archive within a sequence of headers)");
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_EOF);
				}
			}
			if (h == NULL) {  /* Short block at EOF; this is bad. */
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated tar archive"
				    " detected while reading next header");
				return (ARCHIVE_FATAL);
			}
			*unconsumed += 512;

			if (h[0] == 0 && archive_block_is_null(h)) {
				/* We found a NULL block which indicates end-of-archive */

				if (tar->read_concatenated_archives) {
					/* We're ignoring NULL blocks, so keep going. */
					continue;
				}

				/* Try to consume a second all-null record, as well. */
				/* If we can't, that's okay. */
				tar_flush_unconsumed(a, unconsumed);
				h = __archive_read_ahead(a, 512, NULL);
				if (h != NULL && h[0] == 0 && archive_block_is_null(h))
						__archive_read_consume(a, 512);

				archive_clear_error(&a->archive);
				return (ARCHIVE_EOF);
			}

			/* This is NOT a null block, so it must be a valid header. */
			if (!checksum(a, h)) {
				tar_flush_unconsumed(a, unconsumed);
				archive_set_error(&a->archive, EINVAL,
						  "Damaged tar archive (bad header checksum)");
				/* If we've read some critical information (pax headers, etc)
				 * and _then_ see a bad header, we can't really recover. */
				if (eof_fatal) {
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_RETRY);
				}
			}
			break;
		}

		/* Determine the format variant. */
		header = (const struct archive_entry_header_ustar *)h;
		switch(header->typeflag[0]) {
		case 'A': /* Solaris tar ACL */
			if (seen_headers & seen_A_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_A_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "Solaris tar";
			err2 = header_Solaris_ACL(a, tar, entry, h, unconsumed);
			break;
		case 'g': /* POSIX-standard 'g' header. */
			if (seen_headers & seen_g_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_g_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_global(a, tar, entry, h, unconsumed);
			break;
		case 'K': /* Long link name (GNU tar, others) */
			if (seen_headers & seen_K_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_K_header;
			err2 = header_gnu_longlink(a, tar, entry, h, unconsumed);
			break;
		case 'L': /* Long filename (GNU tar, others) */
			if (seen_headers & seen_L_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_L_header;
			err2 = header_gnu_longname(a, tar, entry, h, unconsumed);
			break;
		case 'V': /* GNU volume header */
			if (seen_headers & seen_V_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_V_header;
			err2 = header_volume(a, tar, entry, h, unconsumed);
			break;
		case 'X': /* Used by SUN tar; same as 'x'. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name =
				"POSIX pax interchange format (Sun variant)";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		case 'x': /* POSIX-standard 'x' header. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		default: /* Regular header: Legacy tar, GNU tar, or ustar */
			gnuheader = (const struct archive_entry_header_gnutar *)h;
			if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
				a->archive.archive_format_name = "GNU tar format";
				err2 = header_gnutar(a, tar, entry, h, unconsumed);
			} else if (memcmp(header->magic, "ustar", 5) == 0) {
				if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
					a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
					a->archive.archive_format_name = "POSIX ustar format";
				}
				err2 = header_ustar(a, tar, entry, h);
			} else {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR;
				a->archive.archive_format_name = "tar (non-POSIX)";
				err2 = header_old_tar(a, tar, entry, h);
			}
			err = err_combine(err, err2);
			/* We return warnings or success as-is.  Anything else is fatal. */
			if (err < ARCHIVE_WARN) {
				return (ARCHIVE_FATAL);
			}
			/* Filename of the form `._filename` is an AppleDouble
			 * extension entry.  The body is the macOS metadata blob;
			 * this is followed by another entry with the actual
			 * regular file data.
			 * This design has two drawbacks:
			 * = it's brittle; you might just have a file with such a name
			 * = it duplicates any long pathname extensions
			 *
			 * TODO: This probably shouldn't be here at all.  Consider
			 * just returning the contents as a regular entry here and
			 * then dealing with it when we write data to disk.
			 */
			if (tar->process_mac_extensions
			    && ((seen_headers & seen_mac_metadata) == 0)
			    && is_mac_metadata_entry(entry)) {
				err2 = read_mac_metadata_blob(a, entry, unconsumed);
				if (err2 < ARCHIVE_WARN) {
					return (ARCHIVE_FATAL);
				}
				err = err_combine(err, err2);
				/* Note: Other headers can appear again. */
				seen_headers = seen_mac_metadata;
				break;
			}

			/* Reconcile GNU sparse attributes */
			if (tar->sparse_gnu_attributes_seen) {
				/* Only 'S' (GNU sparse) and ustar '0' regular files can be sparse */
				if (tar->filetype != 'S' && tar->filetype != '0') {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Non-regular file cannot be sparse");
					return (ARCHIVE_WARN);
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 1) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 1 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map is prepended to file contents */
					ssize_t bytes_read;
					bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
					if (bytes_read < 0)
						return ((int)bytes_read);
					tar->entry_bytes_remaining -= bytes_read;
				} else {
					archive_set_error(&a->archive,
							  ARCHIVE_ERRNO_MISC,
							  "Unrecognized GNU sparse file format");
					return (ARCHIVE_WARN);
				}
			}
			return (err);
		}

		/* We're between headers ... */
		err = err_combine(err, err2);
		if (err == ARCHIVE_FATAL)
			return (err);

		/* The GNU volume header and the pax `g` global header
		 * are both allowed to be the only header in an
		 * archive.  If we've seen any other header, a
		 * following EOF is fatal. */
		if ((seen_headers & ~seen_V_header & ~seen_g_header) != 0) {
			eof_fatal = 1;
		}
	}
}